

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O0

void __thiscall
dynet::AttentionalModel<dynet::GRUBuilder>::AttentionalModel
          (AttentionalModel<dynet::GRUBuilder> *this,Model *model,uint vocab_size_src,
          uint _vocab_size_tgt,uint layers,uint hidden_dim,uint align_dim,bool _rnn_src_embeddings,
          bool _giza_positional,bool _giza_markov,bool _giza_fertility,bool _doc_context,
          bool _global_fertility)

{
  uint uVar1;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  initializer_list<unsigned_int> x_10;
  initializer_list<unsigned_int> x_11;
  initializer_list<unsigned_int> x_12;
  initializer_list<unsigned_int> x_13;
  initializer_list<unsigned_int> x_14;
  initializer_list<unsigned_int> x_15;
  initializer_list<unsigned_int> x_16;
  initializer_list<unsigned_int> x_17;
  initializer_list<unsigned_int> x_18;
  initializer_list<unsigned_int> x_19;
  initializer_list<unsigned_int> x_20;
  initializer_list<unsigned_int> x_21;
  Dim *pDVar2;
  undefined4 in_ECX;
  uint in_EDX;
  Dim *in_RSI;
  LookupParameter *in_RDI;
  uint in_R8D;
  uint in_R9D;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  byte in_stack_00000028;
  byte in_stack_00000030;
  byte in_stack_00000038;
  int l;
  int hidden_layers;
  int num_giza;
  value_type *in_stack_fffffffffffff5c8;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *in_stack_fffffffffffff5d0;
  Dim *in_stack_fffffffffffff5f0;
  iterator in_stack_fffffffffffff5f8;
  LookupParameter *in_stack_fffffffffffff600;
  uint local_7bc;
  uint local_798;
  uint local_794;
  uint *local_790;
  undefined8 local_788;
  undefined1 local_758 [16];
  uint local_748;
  int local_744;
  uint *local_740;
  undefined8 local_738;
  undefined1 local_708 [16];
  int local_6f4;
  uint local_6f0;
  undefined4 local_6ec;
  undefined4 *local_6e8;
  undefined8 local_6e0;
  undefined1 local_6b0 [16];
  uint local_69c;
  uint *local_698;
  undefined8 local_690;
  undefined1 local_660 [16];
  undefined4 local_64c;
  undefined4 *local_648;
  undefined8 local_640;
  undefined1 local_610 [16];
  uint local_5fc;
  uint *local_5f8;
  undefined8 local_5f0;
  undefined1 local_5c0 [16];
  uint local_5ac;
  uint *local_5a8;
  undefined8 local_5a0;
  undefined1 local_570 [16];
  uint local_560;
  uint local_55c;
  uint *local_558;
  undefined8 local_550;
  undefined1 local_520 [16];
  uint local_510;
  int local_50c;
  uint *local_508;
  undefined8 local_500;
  undefined1 local_4d0 [16];
  uint local_4c0;
  uint local_4bc;
  uint *local_4b8;
  undefined8 local_4b0;
  undefined1 local_480 [16];
  uint local_470;
  int local_46c;
  uint *local_468;
  undefined8 local_460;
  undefined1 local_430 [16];
  undefined1 local_41c [4];
  undefined1 *local_418;
  undefined8 local_410;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [4];
  int local_3cc;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_390 [16];
  int local_37c;
  uint local_378;
  uint local_374;
  uint *local_370;
  undefined8 local_368;
  undefined1 local_338 [16];
  undefined1 local_328 [4];
  uint local_324;
  undefined1 *local_320;
  undefined8 local_318;
  undefined1 local_2e8 [16];
  uint local_2d8;
  int local_2d4;
  uint *local_2d0;
  undefined8 local_2c8;
  undefined1 local_298 [16];
  undefined1 local_288 [4];
  int local_284;
  undefined1 *local_280;
  undefined8 local_278;
  undefined1 local_248 [16];
  undefined1 local_238 [4];
  int local_234;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_1f8 [16];
  undefined4 local_1e4;
  undefined4 *local_1e0;
  undefined8 local_1d8;
  undefined1 local_1a8 [16];
  uint local_198;
  uint local_194;
  uint *local_190;
  undefined8 local_188;
  undefined1 local_158 [16];
  undefined4 local_148;
  uint local_144;
  undefined4 *local_140;
  undefined8 local_138;
  undefined1 local_108 [16];
  uint local_f4;
  uint *local_f0;
  undefined8 local_e8;
  undefined1 local_b8 [16];
  uint local_a4;
  uint *local_a0;
  undefined8 local_98;
  undefined1 local_68 [16];
  byte local_46;
  byte local_45;
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  uint local_40;
  uint local_3c;
  undefined4 local_38;
  uint local_34;
  Dim *local_30;
  
  local_41 = in_stack_00000010 & 1;
  local_42 = in_stack_00000018 & 1;
  local_43 = in_stack_00000020 & 1;
  local_44 = in_stack_00000028 & 1;
  local_45 = in_stack_00000030 & 1;
  local_46 = in_stack_00000038 & 1;
  local_40 = in_R9D;
  local_3c = in_R8D;
  local_38 = in_ECX;
  local_34 = in_EDX;
  local_30 = in_RSI;
  dynet::LookupParameter::LookupParameter(in_RDI);
  dynet::LookupParameter::LookupParameter(in_RDI + 0x10);
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0x20));
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0x30));
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0x40));
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0x50));
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0x60));
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0x70));
  std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::vector
            ((vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)0x1b17c4);
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0x98));
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0xa8));
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0xb8));
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 200));
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0xd8));
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0xe8));
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0xf8));
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0x108));
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0x118));
  if ((local_41 & 1) == 0) {
    local_7bc = local_40 << 1;
  }
  else {
    local_7bc = local_40 * 3;
  }
  dynet::GRUBuilder::GRUBuilder
            ((GRUBuilder *)(in_RDI + 0x128),local_3c,local_7bc,local_40,(Model *)local_30);
  dynet::GRUBuilder::GRUBuilder
            ((GRUBuilder *)(in_RDI + 0x1c0),1,local_40,local_40,(Model *)local_30);
  dynet::GRUBuilder::GRUBuilder((GRUBuilder *)(in_RDI + 600),1,local_40,local_40,(Model *)local_30);
  in_RDI[0x2f0] = (LookupParameter)(local_41 & 1);
  in_RDI[0x2f1] = (LookupParameter)(local_42 & 1);
  in_RDI[0x2f2] = (LookupParameter)(local_43 & 1);
  in_RDI[0x2f3] = (LookupParameter)(local_44 & 1);
  in_RDI[0x2f4] = (LookupParameter)(local_45 & 1);
  in_RDI[0x2f5] = (LookupParameter)(local_46 & 1);
  *(undefined4 *)(in_RDI + 0x2f8) = local_38;
  expr::Expression::Expression((Expression *)0x1b19e8);
  expr::Expression::Expression((Expression *)0x1b19fe);
  expr::Expression::Expression((Expression *)0x1b1a14);
  expr::Expression::Expression((Expression *)0x1b1a2a);
  expr::Expression::Expression((Expression *)0x1b1a40);
  expr::Expression::Expression((Expression *)0x1b1a56);
  expr::Expression::Expression((Expression *)0x1b1a6c);
  expr::Expression::Expression((Expression *)0x1b1a82);
  expr::Expression::Expression((Expression *)0x1b1a98);
  expr::Expression::Expression((Expression *)0x1b1aae);
  expr::Expression::Expression((Expression *)0x1b1ac4);
  expr::Expression::Expression((Expression *)0x1b1ada);
  expr::Expression::Expression((Expression *)0x1b1af0);
  expr::Expression::Expression((Expression *)0x1b1b06);
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)0x1b1b24);
  std::
  vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
            *)0x1b1b40);
  pDVar2 = local_30;
  *(undefined4 *)(in_RDI + 0x410) = 0;
  local_a4 = local_40;
  local_a0 = &local_a4;
  local_98 = 1;
  x._M_len = (size_type)in_stack_fffffffffffff600;
  x._M_array = in_stack_fffffffffffff5f8;
  Dim::Dim(in_stack_fffffffffffff5f0,x);
  local_68 = dynet::Model::add_lookup_parameters((uint)pDVar2,(Dim *)(ulong)local_34);
  pDVar2 = local_30;
  *(undefined1 (*) [16])in_RDI = local_68;
  uVar1 = *(uint *)(in_RDI + 0x2f8);
  local_f4 = local_40;
  local_f0 = &local_f4;
  local_e8 = 1;
  x_00._M_len = (size_type)in_stack_fffffffffffff600;
  x_00._M_array = in_stack_fffffffffffff5f8;
  Dim::Dim(in_stack_fffffffffffff5f0,x_00);
  local_b8 = dynet::Model::add_lookup_parameters((uint)pDVar2,(Dim *)(ulong)uVar1);
  pDVar2 = local_30;
  *(undefined1 (*) [16])(in_RDI + 0x10) = local_b8;
  local_148 = *(undefined4 *)(in_RDI + 0x2f8);
  local_144 = local_40;
  local_140 = &local_148;
  local_138 = 2;
  x_01._M_len = (size_type)in_stack_fffffffffffff600;
  x_01._M_array = in_stack_fffffffffffff5f8;
  Dim::Dim(in_stack_fffffffffffff5f0,x_01);
  local_108 = dynet::Model::add_parameters(pDVar2,0.0);
  pDVar2 = local_30;
  *(undefined1 (*) [16])(in_RDI + 0x20) = local_108;
  local_198 = local_40;
  local_194 = local_40;
  local_190 = &local_198;
  local_188 = 2;
  x_02._M_len = (size_type)in_stack_fffffffffffff600;
  x_02._M_array = in_stack_fffffffffffff5f8;
  Dim::Dim(in_stack_fffffffffffff5f0,x_02);
  local_158 = dynet::Model::add_parameters(pDVar2,0.0);
  pDVar2 = local_30;
  *(undefined1 (*) [16])(in_RDI + 0x40) = local_158;
  local_1e4 = *(undefined4 *)(in_RDI + 0x2f8);
  local_1e0 = &local_1e4;
  local_1d8 = 1;
  x_03._M_len = (size_type)in_stack_fffffffffffff600;
  x_03._M_array = in_stack_fffffffffffff5f8;
  Dim::Dim(in_stack_fffffffffffff5f0,x_03);
  local_1a8 = dynet::Model::add_parameters(pDVar2,0.0);
  pDVar2 = local_30;
  *(undefined1 (*) [16])(in_RDI + 0x60) = local_1a8;
  local_234 = local_3c * local_40;
  local_230 = local_238;
  local_228 = 2;
  x_04._M_len = (size_type)in_stack_fffffffffffff600;
  x_04._M_array = in_stack_fffffffffffff5f8;
  Dim::Dim(in_stack_fffffffffffff5f0,x_04);
  local_1f8 = dynet::Model::add_parameters(pDVar2,0.0);
  pDVar2 = local_30;
  *(undefined1 (*) [16])(in_RDI + 0x70) = local_1f8;
  if (((byte)in_RDI[0x2f0] & 1) == 0) {
    local_324 = local_40;
    local_320 = local_328;
    local_318 = 2;
    x_07._M_len = (size_type)in_stack_fffffffffffff600;
    x_07._M_array = in_stack_fffffffffffff5f8;
    Dim::Dim(in_stack_fffffffffffff5f0,x_07);
    local_2e8 = dynet::Model::add_parameters(pDVar2,0.0);
    pDVar2 = local_30;
    *(undefined1 (*) [16])(in_RDI + 0x98) = local_2e8;
    local_378 = local_40;
    local_374 = local_40;
    local_370 = &local_378;
    local_368 = 2;
    x_08._M_len = (size_type)in_stack_fffffffffffff600;
    x_08._M_array = in_stack_fffffffffffff5f8;
    Dim::Dim(in_stack_fffffffffffff5f0,x_08);
    local_338 = dynet::Model::add_parameters(pDVar2,0.0);
    *(undefined1 (*) [16])(in_RDI + 0x30) = local_338;
  }
  else {
    local_284 = local_40 * 2;
    local_280 = local_288;
    local_278 = 2;
    x_05._M_len = (size_type)in_stack_fffffffffffff600;
    x_05._M_array = in_stack_fffffffffffff5f8;
    Dim::Dim(in_stack_fffffffffffff5f0,x_05);
    local_248 = dynet::Model::add_parameters(pDVar2,0.0);
    pDVar2 = local_30;
    *(undefined1 (*) [16])(in_RDI + 0x98) = local_248;
    local_2d8 = local_40;
    local_2d4 = local_40 * 2;
    local_2d0 = &local_2d8;
    local_2c8 = 2;
    x_06._M_len = (size_type)in_stack_fffffffffffff600;
    x_06._M_array = in_stack_fffffffffffff5f8;
    Dim::Dim(in_stack_fffffffffffff5f0,x_06);
    local_298 = dynet::Model::add_parameters(pDVar2,0.0);
    *(undefined1 (*) [16])(in_RDI + 0x30) = local_298;
  }
  pDVar2 = local_30;
  if (((((byte)in_RDI[0x2f1] & 1) != 0) || (((byte)in_RDI[0x2f2] & 1) != 0)) ||
     (((byte)in_RDI[0x2f3] & 1) != 0)) {
    local_37c = 0;
    if (((byte)in_RDI[0x2f1] & 1) != 0) {
      local_37c = 3;
    }
    if (((byte)in_RDI[0x2f2] & 1) != 0) {
      local_37c = local_37c + 3;
    }
    if (((byte)in_RDI[0x2f3] & 1) != 0) {
      local_37c = local_37c + 3;
    }
    local_3cc = local_37c;
    local_3c8 = local_3d0;
    local_3c0 = 2;
    x_09._M_len = (size_type)in_stack_fffffffffffff600;
    x_09._M_array = in_stack_fffffffffffff5f8;
    Dim::Dim(in_stack_fffffffffffff5f0,x_09);
    local_390 = dynet::Model::add_parameters(pDVar2,0.0);
    *(undefined1 (*) [16])(in_RDI + 0xb8) = local_390;
  }
  pDVar2 = local_30;
  local_418 = local_41c;
  local_410 = 1;
  x_10._M_len = (size_type)in_stack_fffffffffffff600;
  x_10._M_array = in_stack_fffffffffffff5f8;
  Dim::Dim(in_stack_fffffffffffff5f0,x_10);
  local_3e0 = dynet::Model::add_parameters(pDVar2,0.0);
  pDVar2 = local_30;
  *(undefined1 (*) [16])(in_RDI + 0xa8) = local_3e0;
  if (((byte)in_RDI[0x2f4] & 1) != 0) {
    if (((byte)in_RDI[0x2f0] & 1) == 0) {
      local_4c0 = local_40;
      local_4bc = local_40;
      local_4b8 = &local_4c0;
      local_4b0 = 2;
      x_12._M_len = (size_type)in_stack_fffffffffffff600;
      x_12._M_array = in_stack_fffffffffffff5f8;
      Dim::Dim(in_stack_fffffffffffff5f0,x_12);
      local_480 = dynet::Model::add_parameters(pDVar2,0.0);
      *(undefined1 (*) [16])(in_RDI + 0x50) = local_480;
    }
    else {
      local_470 = local_40;
      local_46c = local_40 * 2;
      local_468 = &local_470;
      local_460 = 2;
      x_11._M_len = (size_type)in_stack_fffffffffffff600;
      x_11._M_array = in_stack_fffffffffffff5f8;
      Dim::Dim(in_stack_fffffffffffff5f0,x_11);
      local_430 = dynet::Model::add_parameters(pDVar2,0.0);
      *(undefined1 (*) [16])(in_RDI + 0x50) = local_430;
    }
  }
  pDVar2 = local_30;
  if (((byte)in_RDI[0x2f5] & 1) != 0) {
    if (((byte)in_RDI[0x2f0] & 1) == 0) {
      local_560 = local_40;
      local_55c = local_40;
      local_558 = &local_560;
      local_550 = 2;
      x_14._M_len = (size_type)in_stack_fffffffffffff600;
      x_14._M_array = in_stack_fffffffffffff5f8;
      Dim::Dim(in_stack_fffffffffffff5f0,x_14);
      local_520 = dynet::Model::add_parameters(pDVar2,0.0);
      *(undefined1 (*) [16])(in_RDI + 200) = local_520;
    }
    else {
      local_510 = local_40;
      local_50c = local_40 * 2;
      local_508 = &local_510;
      local_500 = 2;
      x_13._M_len = (size_type)in_stack_fffffffffffff600;
      x_13._M_array = in_stack_fffffffffffff5f8;
      Dim::Dim(in_stack_fffffffffffff5f0,x_13);
      local_4d0 = dynet::Model::add_parameters(pDVar2,0.0);
      *(undefined1 (*) [16])(in_RDI + 200) = local_4d0;
    }
    pDVar2 = local_30;
    local_5ac = local_40;
    local_5a8 = &local_5ac;
    local_5a0 = 1;
    x_15._M_len = (size_type)in_stack_fffffffffffff600;
    x_15._M_array = in_stack_fffffffffffff5f8;
    Dim::Dim(in_stack_fffffffffffff5f0,x_15);
    local_570 = dynet::Model::add_parameters(pDVar2,0.0);
    pDVar2 = local_30;
    *(undefined1 (*) [16])(in_RDI + 0xf8) = local_570;
    local_5fc = local_40;
    local_5f8 = &local_5fc;
    local_5f0 = 1;
    x_16._M_len = (size_type)in_stack_fffffffffffff600;
    x_16._M_array = in_stack_fffffffffffff5f8;
    Dim::Dim(in_stack_fffffffffffff5f0,x_16);
    local_5c0 = dynet::Model::add_parameters(pDVar2,0.0);
    pDVar2 = local_30;
    *(undefined1 (*) [16])(in_RDI + 0xd8) = local_5c0;
    local_64c = 1;
    local_648 = &local_64c;
    local_640 = 1;
    x_17._M_len = (size_type)in_stack_fffffffffffff600;
    x_17._M_array = in_stack_fffffffffffff5f8;
    Dim::Dim(in_stack_fffffffffffff5f0,x_17);
    local_610 = dynet::Model::add_parameters(pDVar2,0.0);
    pDVar2 = local_30;
    *(undefined1 (*) [16])(in_RDI + 0x108) = local_610;
    local_69c = local_40;
    local_698 = &local_69c;
    local_690 = 1;
    x_18._M_len = (size_type)in_stack_fffffffffffff600;
    x_18._M_array = in_stack_fffffffffffff5f8;
    Dim::Dim(in_stack_fffffffffffff5f0,x_18);
    local_660 = dynet::Model::add_parameters(pDVar2,0.0);
    pDVar2 = local_30;
    *(undefined1 (*) [16])(in_RDI + 0xe8) = local_660;
    local_6ec = 1;
    local_6e8 = &local_6ec;
    local_6e0 = 1;
    x_19._M_len = (size_type)in_stack_fffffffffffff600;
    x_19._M_array = in_stack_fffffffffffff5f8;
    Dim::Dim(in_stack_fffffffffffff5f0,x_19);
    local_6b0 = dynet::Model::add_parameters(pDVar2,0.0);
    *(undefined1 (*) [16])(in_RDI + 0x118) = local_6b0;
  }
  local_6f0 = GRUBuilder::num_h0_components((GRUBuilder *)(in_RDI + 0x128));
  auVar3._8_8_ = in_stack_fffffffffffff5f0;
  auVar3._0_8_ = in_stack_fffffffffffff5f8;
  local_6f4 = 0;
  while( true ) {
    pDVar2 = local_30;
    if ((int)local_6f0 <= local_6f4) break;
    if (((byte)in_RDI[0x2f0] & 1) == 0) {
      local_798 = local_40;
      local_794 = local_40;
      local_790 = &local_798;
      local_788 = 2;
      x_21._M_len = (size_type)in_stack_fffffffffffff600;
      x_21._M_array = auVar3._0_8_;
      Dim::Dim(auVar3._8_8_,x_21);
      auVar4 = dynet::Model::add_parameters(pDVar2,0.0);
      in_stack_fffffffffffff5d0 = auVar4._8_8_;
      local_758 = auVar4;
      std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::push_back
                (in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
    }
    else {
      in_stack_fffffffffffff600 = in_RDI + 0x80;
      local_748 = local_40;
      local_744 = local_40 * 2;
      local_740 = &local_748;
      local_738 = 2;
      x_20._M_len = (size_type)in_stack_fffffffffffff600;
      x_20._M_array = auVar3._0_8_;
      Dim::Dim(auVar3._8_8_,x_20);
      auVar3 = dynet::Model::add_parameters(pDVar2,0.0);
      local_708 = auVar3;
      std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::push_back
                (in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
    }
    local_6f4 = local_6f4 + 1;
  }
  return;
}

Assistant:

AttentionalModel<Builder>::AttentionalModel(dynet::Model* model,
    unsigned vocab_size_src, unsigned _vocab_size_tgt, unsigned layers, unsigned hidden_dim, 
    unsigned align_dim, bool _rnn_src_embeddings, bool _giza_positional, 
    bool _giza_markov, bool _giza_fertility, bool _doc_context,
    bool _global_fertility)
: builder(layers, (_rnn_src_embeddings) ? 3*hidden_dim : 2*hidden_dim, hidden_dim, *model),
  builder_src_fwd(1, hidden_dim, hidden_dim, *model),
  builder_src_bwd(1, hidden_dim, hidden_dim, *model),
  rnn_src_embeddings(_rnn_src_embeddings), 
  giza_positional(_giza_positional), giza_markov(_giza_markov), giza_fertility(_giza_fertility),
  doc_context(_doc_context),
  global_fertility(_global_fertility),
  vocab_size_tgt(_vocab_size_tgt),
  num_aux_vecs(0)
{
    //std::cerr << "Attentionalmodel(" << vocab_size_src  << " " <<  _vocab_size_tgt  << " " <<  layers  << " " <<  hidden_dim << " " <<  align_dim  << " " <<  _rnn_src_embeddings  << " " <<  _giza_extentions  << " " <<  _doc_context << ")\n";
    
    p_cs = model->add_lookup_parameters(vocab_size_src, {hidden_dim}); 
    p_ct = model->add_lookup_parameters(vocab_size_tgt, {hidden_dim}); 
    p_R = model->add_parameters({vocab_size_tgt, hidden_dim});
    p_P = model->add_parameters({hidden_dim, hidden_dim});
    p_bias = model->add_parameters({vocab_size_tgt});
    p_Wa = model->add_parameters({align_dim, layers*hidden_dim});
    if (rnn_src_embeddings) {
        p_Ua = model->add_parameters({align_dim, 2*hidden_dim});
	p_Q = model->add_parameters({hidden_dim, 2*hidden_dim});
    } else {
        p_Ua = model->add_parameters({align_dim, hidden_dim});
	p_Q = model->add_parameters({hidden_dim, hidden_dim});
    }
    if (giza_positional || giza_markov || giza_fertility) {
        int num_giza = 0;
        if (giza_positional) num_giza += 3;
        if (giza_markov) num_giza += 3;
        if (giza_fertility) num_giza += 3;
        p_Ta = model->add_parameters({align_dim, (unsigned int)num_giza});
    }
    p_va = model->add_parameters({align_dim});

    if (doc_context) {
        if (rnn_src_embeddings) {
            p_S = model->add_parameters({hidden_dim, 2*hidden_dim});
        } else {
            p_S = model->add_parameters({hidden_dim, hidden_dim});
        }
    }

    if (global_fertility) {
        if (rnn_src_embeddings) {
            p_Wfhid = model->add_parameters({hidden_dim, 2*hidden_dim});
        } else {
            p_Wfhid = model->add_parameters({hidden_dim, hidden_dim});
        }
        p_bfhid = model->add_parameters({hidden_dim});
        p_Wfmu = model->add_parameters({hidden_dim});
        p_bfmu = model->add_parameters({1});
        p_Wfvar = model->add_parameters({hidden_dim});
        p_bfvar = model->add_parameters({1});
    }

    int hidden_layers = builder.num_h0_components();
    for (int l = 0; l < hidden_layers; ++l) {
	if (rnn_src_embeddings)
	    p_Wh0.push_back(model->add_parameters({hidden_dim, 2*hidden_dim}));
	else
	    p_Wh0.push_back(model->add_parameters({hidden_dim, hidden_dim}));
    }
}